

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O0

CURLcode smb_send_write(Curl_easy *data)

{
  smb_request *psVar1;
  curl_off_t cVar2;
  smb_header *h;
  size_t sStack_38;
  CURLcode result;
  curl_off_t upload_size;
  curl_off_t offset;
  smb_request *req;
  smb_write *msg;
  Curl_easy *data_local;
  
  psVar1 = (data->req).p.smb;
  cVar2 = (data->req).offset;
  sStack_38 = (data->req).size - (data->req).bytecount;
  data_local._4_4_ = Curl_get_upload_buffer(data);
  if (data_local._4_4_ == CURLE_OK) {
    h = (smb_header *)(data->state).ulbuf;
    if (0x7ffe < (long)sStack_38) {
      sStack_38 = 0x7fff;
    }
    memset(h,0,0x44);
    h[1].nbt_type = '\x0e';
    h[1].nbt_flags = 0xff;
    *(unsigned_short *)(h[1].magic + 1) = psVar1->fid;
    *(int *)(h[1].magic + 3) = (int)cVar2;
    *(int *)(h[1].signature + 7) = (int)((ulong)cVar2 >> 0x20);
    *(short *)(h[1].signature + 3) = (short)sStack_38;
    h[1].signature[5] = '@';
    h[1].signature[6] = '\0';
    *(short *)((long)&h[1].tid + 1) = (short)sStack_38 + 1;
    smb_format_message(data,h,'/',sStack_38 + 0x20);
    data_local._4_4_ = smb_send(data,0x44,sStack_38);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smb_send_write(struct Curl_easy *data)
{
  struct smb_write *msg;
  struct smb_request *req = data->req.p.smb;
  curl_off_t offset = data->req.offset;
  curl_off_t upload_size = data->req.size - data->req.bytecount;
  CURLcode result = Curl_get_upload_buffer(data);
  if(result)
    return result;
  msg = (struct smb_write *)data->state.ulbuf;

  if(upload_size >= MAX_PAYLOAD_SIZE - 1) /* There is one byte of padding */
    upload_size = MAX_PAYLOAD_SIZE - 1;

  memset(msg, 0, sizeof(*msg));
  msg->word_count = SMB_WC_WRITE_ANDX;
  msg->andx.command = SMB_COM_NO_ANDX_COMMAND;
  msg->fid = smb_swap16(req->fid);
  msg->offset = smb_swap32((unsigned int) offset);
  msg->offset_high = smb_swap32((unsigned int) (offset >> 32));
  msg->data_length = smb_swap16((unsigned short) upload_size);
  msg->data_offset = smb_swap16(sizeof(*msg) - sizeof(unsigned int));
  msg->byte_count = smb_swap16((unsigned short) (upload_size + 1));

  smb_format_message(data, &msg->h, SMB_COM_WRITE_ANDX,
                     sizeof(*msg) - sizeof(msg->h) + (size_t) upload_size);

  return smb_send(data, sizeof(*msg), (size_t) upload_size);
}